

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O3

void __thiscall Assimp::LWOImporter::LoadLWOTags(LWOImporter *this,uint size)

{
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  uint8_t *puVar1;
  long lVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (size != 0) {
    puVar3 = this->mFileBuffer;
    puVar1 = puVar3 + size;
    puVar4 = puVar3;
    do {
      if (*puVar4 == '\0') {
        lVar2 = (long)puVar4 - (long)puVar3;
        if (lVar2 != 0) {
          this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this->mTags
          ;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,puVar3,puVar3 + lVar2)
          ;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(this_00,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        puVar3 = puVar4 + (2 - (ulong)((uint)lVar2 & 1));
        puVar4 = puVar3;
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 < puVar1);
  }
  return;
}

Assistant:

void LWOImporter::LoadLWOTags(unsigned int size)
{
    // --- this function is used for both LWO2 and LWOB

    const char* szCur = (const char*)mFileBuffer, *szLast = szCur;
    const char* const szEnd = szLast+size;
    while (szCur < szEnd)
    {
        if (!(*szCur))
        {
            const size_t len = (size_t)(szCur-szLast);
            // FIX: skip empty-sized tags
            if (len)
                mTags->push_back(std::string(szLast,len));
            szCur += (len&0x1 ? 1 : 2);
            szLast = szCur;
        }
        szCur++;
    }
}